

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::test_script_parsing::test_method(test_script_parsing *this)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  Span<const_char> *span;
  Span<const_char> *span_00;
  Span<const_char> *span_01;
  Span<const_char> *span_02;
  Span<const_char> *span_03;
  Span<const_char> *span_04;
  Span<const_char> *span_05;
  Span<const_char> *span_06;
  Span<const_char> *span_07;
  Span<const_char> *span_08;
  Span<const_char> *span_09;
  Span<const_char> *span_10;
  Span<const_char> *span_11;
  Span<const_char> *span_12;
  Span<const_char> *span_13;
  Span<const_char> *span_14;
  Span<const_char> *span_15;
  Span<const_char> *span_16;
  Span<const_char> *span_17;
  Span<const_char> *span_18;
  Span<const_char> *span_19;
  Span<const_char> *span_20;
  Span<const_char> *span_21;
  Span<const_char> *span_22;
  Span<const_char> *span_23;
  Span<const_char> *span_24;
  Span<const_char> *span_25;
  Span<const_char> *span_26;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  string *psVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  check_type cVar7;
  char *local_8f0;
  char *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  undefined4 local_61c;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> results;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  Span<const_char> local_3e8;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  Span<const_char> local_a8;
  string local_98;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined8 local_60;
  string input;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"MilkToastHoney");
  local_a8.m_data = input._M_dataplus._M_p;
  local_a8.m_size = input._M_string_length;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"",(allocator<char> *)&local_98);
  bVar2 = ::script::Const((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c1533;
  file.m_end = (iterator)0x524;
  file.m_begin = (iterator)&local_b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c8,msg);
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc54936;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc5493d;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_d0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  local_98._M_dataplus._M_p._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_d8,0x524);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x525;
  file_00.m_begin = (iterator)&local_e8;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f8,msg_00
            );
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_100 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
            (local_78,&local_108,0x525,1,2,psVar6,"SpanToStr(sp)","MilkToastHoney",
             "\"MilkToastHoney\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Milk",(allocator<char> *)&local_98);
  bVar2 = ::script::Const((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c170a;
  file_01.m_end = (iterator)0x528;
  file_01.m_begin = (iterator)&local_118;
  msg_01.m_end = (iterator)psVar6;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_128,
             msg_01);
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc54936;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc5493d;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  local_98._M_dataplus._M_p._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_138,0x528);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x529;
  file_02.m_begin = (iterator)&local_148;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_158,
             msg_02);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_00);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_78,&local_168,0x529,1,2,psVar6,"SpanToStr(sp)","ToastHoney","\"ToastHoney\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Bread",(allocator<char> *)&local_98);
  bVar2 = ::script::Const((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c18e8;
  file_03.m_end = (iterator)0x52c;
  file_03.m_begin = (iterator)&local_178;
  msg_03.m_end = (iterator)psVar6;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_188,
             msg_03);
  local_98._M_dataplus._M_p._0_1_ = !bVar2;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b92ca;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xb6a5c9;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_190 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_198,0x52c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Toast",(allocator<char> *)&local_98);
  bVar2 = ::script::Const((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c19ea;
  file_04.m_end = (iterator)0x52f;
  file_04.m_begin = (iterator)&local_1a8;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1b8,
             msg_04);
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc54936;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc5493d;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1c0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  local_98._M_dataplus._M_p._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_1c8,0x52f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x530;
  file_05.m_begin = (iterator)&local_1d8;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1e8,
             msg_05);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f0 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_01);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (local_78,&local_1f8,0x530,1,2,psVar6,"SpanToStr(sp)","Honey","\"Honey\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Honeybadger",(allocator<char> *)&local_98);
  bVar2 = ::script::Const((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c1bc8;
  file_06.m_end = (iterator)0x533;
  file_06.m_begin = (iterator)&local_208;
  msg_06.m_end = (iterator)psVar6;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_218,
             msg_06);
  local_98._M_dataplus._M_p._0_1_ = !bVar2;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b92ca;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xb6a5c9;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_220 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_228,0x533);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Honey",(allocator<char> *)&local_98);
  bVar2 = ::script::Const((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c1cc3;
  file_07.m_end = (iterator)0x536;
  file_07.m_begin = (iterator)&local_238;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_248,
             msg_07);
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc54936;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc5493d;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_250 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  local_98._M_dataplus._M_p._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_258,0x536);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x537;
  file_08.m_begin = (iterator)&local_268;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_278,
             msg_08);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_280 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_02);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_78,&local_288,0x537,1,2,psVar6,"SpanToStr(sp)","","\"\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"Foo(Bar(xy,z()))");
  local_a8.m_data = input._M_dataplus._M_p;
  local_a8.m_size = input._M_string_length;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"FooBar",(allocator<char> *)&local_98);
  bVar2 = ::script::Func((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c1ebd;
  file_09.m_end = (iterator)0x53e;
  file_09.m_begin = (iterator)&local_298;
  msg_09.m_end = (iterator)psVar6;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2a8,
             msg_09);
  local_98._M_dataplus._M_p._0_1_ = !bVar2;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b92ca;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xb6a5c9;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2b0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_2b8,0x53e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Foo(",(allocator<char> *)&local_98);
  bVar2 = ::script::Func((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c1fb8;
  file_10.m_end = (iterator)0x541;
  file_10.m_begin = (iterator)&local_2c8;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2d8,
             msg_10);
  local_98._M_dataplus._M_p._0_1_ = !bVar2;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b92ca;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xb6a5c9;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2e0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_2e8,0x541);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Foo",(allocator<char> *)&local_98);
  bVar2 = ::script::Func((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c20b3;
  file_11.m_end = (iterator)0x544;
  file_11.m_begin = (iterator)&local_2f8;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_308,
             msg_11);
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc54936;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc5493d;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_310 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  local_98._M_dataplus._M_p._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_318,0x544);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x545;
  file_12.m_begin = (iterator)&local_328;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_338,
             msg_12);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_340 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_03);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (local_78,&local_348,0x545,1,2,psVar6,"SpanToStr(sp)","Bar(xy,z())","\"Bar(xy,z())\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Bar",(allocator<char> *)&local_98);
  bVar2 = ::script::Func((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c2291;
  file_13.m_end = (iterator)0x548;
  file_13.m_begin = (iterator)&local_358;
  msg_13.m_end = (iterator)psVar6;
  msg_13.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_368,
             msg_13);
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc54936;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc5493d;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_370 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  local_98._M_dataplus._M_p._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_378,0x548);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x549;
  file_14.m_begin = (iterator)&local_388;
  msg_14.m_end = pvVar5;
  msg_14.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_398,
             msg_14);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3a0 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_04);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_78,&local_3a8,0x549,1,2,psVar6,"SpanToStr(sp)","xy,z()","\"xy,z()\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"xy",(allocator<char> *)&local_98);
  bVar2 = ::script::Func((string *)local_78,&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5c246f;
  file_15.m_end = (iterator)0x54c;
  file_15.m_begin = (iterator)&local_3b8;
  msg_15.m_end = (iterator)psVar6;
  msg_15.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3c8,
             msg_15);
  local_98._M_dataplus._M_p._0_1_ = !bVar2;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b92ca;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xb6a5c9;
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011481f0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3d0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_60 = &results;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar7,
             (size_t)&local_3d8,0x54c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"(n*(n-1))/2");
  local_a8.m_data = input._M_dataplus._M_p;
  local_a8.m_size = input._M_string_length;
  local_3e8 = ::script::Expr(&local_a8);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x554;
  file_16.m_begin = (iterator)&local_3f8;
  msg_16.m_end = pvVar5;
  msg_16.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_408,
             msg_16);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_410 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_3e8,span_05);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (local_78,&local_418,0x554,1,2,psVar6,"SpanToStr(result)","(n*(n-1))/2",
             "\"(n*(n-1))/2\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x555;
  file_17.m_begin = (iterator)&local_428;
  msg_17.m_end = (iterator)psVar6;
  msg_17.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_438,
             msg_17);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_440 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_06);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_78,&local_448,0x555,1,2,psVar6,"SpanToStr(sp)","","\"\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"foo,bar");
  local_a8.m_data = input._M_dataplus._M_p;
  local_a8.m_size = input._M_string_length;
  local_3e8 = ::script::Expr(&local_a8);
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x55a;
  file_18.m_begin = (iterator)&local_458;
  msg_18.m_end = (iterator)psVar6;
  msg_18.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_468,
             msg_18);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_470 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_3e8,span_07);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_78,&local_478,0x55a,1,2,psVar6,"SpanToStr(result)","foo","\"foo\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x55b;
  file_19.m_begin = (iterator)&local_488;
  msg_19.m_end = (iterator)psVar6;
  msg_19.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_498,
             msg_19);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4a0 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_08);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_78,&local_4a8,0x55b,1,2,psVar6,"SpanToStr(sp)",",bar","\",bar\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"(aaaaa,bbbbb()),c");
  local_a8.m_data = input._M_dataplus._M_p;
  local_a8.m_size = input._M_string_length;
  local_3e8 = ::script::Expr(&local_a8);
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x560;
  file_20.m_begin = (iterator)&local_4b8;
  msg_20.m_end = (iterator)psVar6;
  msg_20.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4c8,
             msg_20);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4d0 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_3e8,span_09);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
            (local_78,&local_4d8,0x560,1,2,psVar6,"SpanToStr(result)","(aaaaa,bbbbb())",
             "\"(aaaaa,bbbbb())\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x561;
  file_21.m_begin = (iterator)&local_4e8;
  msg_21.m_end = (iterator)psVar6;
  msg_21.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4f8,
             msg_21);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_500 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_10);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_78,&local_508,0x561,1,2,psVar6,"SpanToStr(sp)",",c","\",c\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"xyz)foo");
  local_a8.m_data = input._M_dataplus._M_p;
  local_a8.m_size = input._M_string_length;
  local_3e8 = ::script::Expr(&local_a8);
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x566;
  file_22.m_begin = (iterator)&local_518;
  msg_22.m_end = (iterator)psVar6;
  msg_22.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_528,
             msg_22);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_530 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_3e8,span_11);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_78,&local_538,0x566,1,2,psVar6,"SpanToStr(result)","xyz","\"xyz\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x567;
  file_23.m_begin = (iterator)&local_548;
  msg_23.m_end = (iterator)psVar6;
  msg_23.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_558,
             msg_23);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_560 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_12);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_78,&local_568,0x567,1,2,psVar6,"SpanToStr(sp)",")foo","\")foo\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"((a),(b),(c)),xxx");
  local_a8.m_data = input._M_dataplus._M_p;
  local_a8.m_size = input._M_string_length;
  local_3e8 = ::script::Expr(&local_a8);
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x56c;
  file_24.m_begin = (iterator)&local_578;
  msg_24.m_end = (iterator)psVar6;
  msg_24.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_588,
             msg_24);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_590 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_3e8,span_13);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
            (local_78,&local_598,0x56c,1,2,psVar6,"SpanToStr(result)","((a),(b),(c))",
             "\"((a),(b),(c))\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x56d;
  file_25.m_begin = (iterator)&local_5a8;
  msg_25.m_end = (iterator)psVar6;
  msg_25.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_5b8,
             msg_25);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5c0 = "";
  SpanToStr_abi_cxx11_(&local_98,(util_tests *)&local_a8,span_14);
  cVar3 = '\x01';
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_78,&local_5c8,0x56d);
  std::__cxx11::string::~string((string *)&local_98);
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"xxx");
  local_98._M_dataplus._M_p = input._M_dataplus._M_p;
  local_98._M_string_length = input._M_string_length;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78,
             (util *)&local_98,(Span<const_char> *)0x78,cVar3);
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::_M_move_assign
            (&results,(_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78
            );
  std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
            ((_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78);
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x574;
  file_26.m_begin = (iterator)&local_5f8;
  msg_26.m_end = (iterator)psVar6;
  msg_26.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_608,
             msg_26);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_610 = "";
  local_98._M_dataplus._M_p =
       (pointer)((long)results.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)results.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4);
  psVar6 = &local_98;
  local_61c = 4;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_78,&local_618,0x574,1,2,psVar6,"results.size()",&local_61c,"4U");
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x575;
  file_27.m_begin = (iterator)&local_630;
  msg_27.m_end = (iterator)psVar6;
  msg_27.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_640,
             msg_27);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_648 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
             _M_impl.super__Vector_impl_data._M_start,span_15);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_78,&local_650,0x575,1,2,psVar6,"SpanToStr(results[0])","","\"\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x576;
  file_28.m_begin = (iterator)&local_660;
  msg_28.m_end = (iterator)psVar6;
  msg_28.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_670,
             msg_28);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_678 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             (results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start + 1),span_16);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_78,&local_680,0x576,1,2,psVar6,"SpanToStr(results[1])","","\"\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x577;
  file_29.m_begin = (iterator)&local_690;
  msg_29.m_end = (iterator)psVar6;
  msg_29.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_6a0,
             msg_29);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6a8 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             (results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start + 2),span_17);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_78,&local_6b0,0x577,1,2,psVar6,"SpanToStr(results[2])","","\"\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x578;
  file_30.m_begin = (iterator)&local_6c0;
  msg_30.m_end = (iterator)psVar6;
  msg_30.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_6d0,
             msg_30);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6d8 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             (results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start + 3),span_18);
  cVar3 = '\x01';
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_78,&local_6e0,0x578);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"one#two#three");
  local_98._M_dataplus._M_p = input._M_dataplus._M_p;
  local_98._M_string_length = input._M_string_length;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78,
             (util *)&local_98,(Span<const_char> *)0x2d,cVar3);
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::_M_move_assign
            (&results,(_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78
            );
  std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
            ((_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78);
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x57c;
  file_31.m_begin = (iterator)&local_6f0;
  msg_31.m_end = (iterator)psVar6;
  msg_31.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_700,
             msg_31);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_708 = "";
  local_98._M_dataplus._M_p =
       (pointer)((long)results.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)results.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4);
  psVar6 = &local_98;
  local_61c = 1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_78,&local_710,0x57c,1,2,psVar6,"results.size()",&local_61c,"1U");
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x57d;
  file_32.m_begin = (iterator)&local_720;
  msg_32.m_end = (iterator)psVar6;
  msg_32.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_730,
             msg_32);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_738 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
             _M_impl.super__Vector_impl_data._M_start,span_19);
  cVar3 = '\x01';
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
            (local_78,&local_740,0x57d);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"one#two#three");
  local_98._M_dataplus._M_p = input._M_dataplus._M_p;
  local_98._M_string_length = input._M_string_length;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78,
             (util *)&local_98,(Span<const_char> *)0x23,cVar3);
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::_M_move_assign
            (&results,(_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78
            );
  std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
            ((_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78);
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x581;
  file_33.m_begin = (iterator)&local_750;
  msg_33.m_end = (iterator)psVar6;
  msg_33.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_760,
             msg_33);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_770 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_768 = "";
  local_98._M_dataplus._M_p =
       (pointer)((long)results.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)results.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4);
  psVar6 = &local_98;
  local_61c = 3;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_78,&local_770,0x581,1,2,psVar6,"results.size()",&local_61c,"3U");
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x582;
  file_34.m_begin = (iterator)&local_780;
  msg_34.m_end = (iterator)psVar6;
  msg_34.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_790,
             msg_34);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_798 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
             _M_impl.super__Vector_impl_data._M_start,span_20);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_78,&local_7a0,0x582,1,2,psVar6,"SpanToStr(results[0])","one","\"one\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x583;
  file_35.m_begin = (iterator)&local_7b0;
  msg_35.m_end = (iterator)psVar6;
  msg_35.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_7c0,
             msg_35);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_7c8 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             (results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start + 1),span_21);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_78,&local_7d0,0x583,1,2,psVar6,"SpanToStr(results[1])","two","\"two\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x584;
  file_36.m_begin = (iterator)&local_7e0;
  msg_36.m_end = (iterator)psVar6;
  msg_36.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_7f0,
             msg_36);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_7f8 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             (results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start + 2),span_22);
  cVar3 = '\x01';
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (local_78,&local_800,0x584);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&input,"*foo*bar*");
  local_98._M_dataplus._M_p = input._M_dataplus._M_p;
  local_98._M_string_length = input._M_string_length;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78,
             (util *)&local_98,(Span<const_char> *)0x2a,cVar3);
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::_M_move_assign
            (&results,(_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78
            );
  std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
            ((_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78);
  local_810 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x588;
  file_37.m_begin = (iterator)&local_810;
  msg_37.m_end = (iterator)psVar6;
  msg_37.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_820,
             msg_37);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_830 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_828 = "";
  local_98._M_dataplus._M_p =
       (pointer)((long)results.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)results.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4);
  psVar6 = &local_98;
  local_61c = 4;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_78,&local_830,0x588,1,2,psVar6,"results.size()",&local_61c,"4U");
  local_840 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x589;
  file_38.m_begin = (iterator)&local_840;
  msg_38.m_end = (iterator)psVar6;
  msg_38.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_850,
             msg_38);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_860 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_858 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
             _M_impl.super__Vector_impl_data._M_start,span_23);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_78,&local_860,0x589,1,2,psVar6,"SpanToStr(results[0])","","\"\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_870 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_868 = "";
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x58a;
  file_39.m_begin = (iterator)&local_870;
  msg_39.m_end = (iterator)psVar6;
  msg_39.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_880,
             msg_39);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_890 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_888 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             (results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start + 1),span_24);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_78,&local_890,0x58a,1,2,psVar6,"SpanToStr(results[1])","foo","\"foo\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_8a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x58b;
  file_40.m_begin = (iterator)&local_8a0;
  msg_40.m_end = (iterator)psVar6;
  msg_40.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_8b0,
             msg_40);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_8c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_8b8 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             (results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start + 2),span_25);
  pvVar4 = (iterator)0x2;
  psVar6 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_78,&local_8c0,0x58b,1,2,psVar6,"SpanToStr(results[2])","bar","\"bar\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_8d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_8c8 = "";
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x58c;
  file_41.m_begin = (iterator)&local_8d0;
  msg_41.m_end = (iterator)psVar6;
  msg_41.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_8e0,
             msg_41);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_8f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_8e8 = "";
  SpanToStr_abi_cxx11_
            (&local_98,
             (util_tests *)
             (results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start + 3),span_26);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_78,&local_8f0,0x58c,1,2,&local_98,"SpanToStr(results[3])","","\"\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
            (&results.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>);
  std::__cxx11::string::~string((string *)&input);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_script_parsing)
{
    using namespace script;
    std::string input;
    Span<const char> sp;
    bool success;

    // Const(...): parse a constant, update span to skip it if successful
    input = "MilkToastHoney";
    sp = input;
    success = Const("", sp); // empty
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "MilkToastHoney");

    success = Const("Milk", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "ToastHoney");

    success = Const("Bread", sp);
    BOOST_CHECK(!success);

    success = Const("Toast", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "Honey");

    success = Const("Honeybadger", sp);
    BOOST_CHECK(!success);

    success = Const("Honey", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "");

    // Func(...): parse a function call, update span to argument if successful
    input = "Foo(Bar(xy,z()))";
    sp = input;

    success = Func("FooBar", sp);
    BOOST_CHECK(!success);

    success = Func("Foo(", sp);
    BOOST_CHECK(!success);

    success = Func("Foo", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "Bar(xy,z())");

    success = Func("Bar", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "xy,z()");

    success = Func("xy", sp);
    BOOST_CHECK(!success);

    // Expr(...): return expression that span begins with, update span to skip it
    Span<const char> result;

    input = "(n*(n-1))/2";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "(n*(n-1))/2");
    BOOST_CHECK_EQUAL(SpanToStr(sp), "");

    input = "foo,bar";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "foo");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ",bar");

    input = "(aaaaa,bbbbb()),c";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "(aaaaa,bbbbb())");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ",c");

    input = "xyz)foo";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "xyz");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ")foo");

    input = "((a),(b),(c)),xxx";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "((a),(b),(c))");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ",xxx");

    // Split(...): split a string on every instance of sep, return vector
    std::vector<Span<const char>> results;

    input = "xxx";
    results = Split(input, 'x');
    BOOST_CHECK_EQUAL(results.size(), 4U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[1]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[2]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[3]), "");

    input = "one#two#three";
    results = Split(input, '-');
    BOOST_CHECK_EQUAL(results.size(), 1U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "one#two#three");

    input = "one#two#three";
    results = Split(input, '#');
    BOOST_CHECK_EQUAL(results.size(), 3U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "one");
    BOOST_CHECK_EQUAL(SpanToStr(results[1]), "two");
    BOOST_CHECK_EQUAL(SpanToStr(results[2]), "three");

    input = "*foo*bar*";
    results = Split(input, '*');
    BOOST_CHECK_EQUAL(results.size(), 4U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[1]), "foo");
    BOOST_CHECK_EQUAL(SpanToStr(results[2]), "bar");
    BOOST_CHECK_EQUAL(SpanToStr(results[3]), "");
}